

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

int __thiscall QNetworkReplyImpl::close(QNetworkReplyImpl *this,int __fd)

{
  QNetworkReplyImplPrivate *this_00;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReplyImplPrivate **)(this + 8);
  if (1 < this_00->state - Finished) {
    if (this_00->backend != (QNetworkAccessBackend *)0x0) {
      (**(code **)(*(long *)this_00->backend + 0x70))();
    }
    if ((QObject *)this_00->copyDevice != (QObject *)0x0) {
      __fd = 0;
      QObject::disconnect((QObject *)this_00->copyDevice,(char *)0x0,(QObject *)this,(char *)0x0);
    }
    QNetworkReply::close((QNetworkReply *)this,__fd);
    QMetaObject::tr((char *)&local_30,(char *)&staticMetaObject,0x261b6a);
    QNetworkReplyImplPrivate::error(this_00,OperationCanceledError,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    QNetworkReplyImplPrivate::finished(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImpl::close()
{
    Q_D(QNetworkReplyImpl);
    if (d->state == QNetworkReplyPrivate::Aborted ||
        d->state == QNetworkReplyPrivate::Finished)
        return;

    // stop the download
    if (d->backend)
        d->backend->close();
    if (d->copyDevice)
        disconnect(d->copyDevice, nullptr, this, nullptr);

    QNetworkReply::close();

    // call finished which will emit signals
    d->error(OperationCanceledError, tr("Operation canceled"));
    d->finished();
}